

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::setSelectionModel(QTableView *this,QItemSelectionModel *selectionModel)

{
  long lVar1;
  long lVar2;
  void **ppvVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  void **ppvVar6;
  long in_FS_OFFSET;
  QSlotObjectBase local_60;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 800) != 0) && (*(int *)(*(long *)(lVar1 + 800) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x328) != 0)) {
    QObject::disconnect((Connection *)(lVar1 + 0x5a0));
  }
  (**(code **)(**(long **)(lVar1 + 0x588) + 0x1d0))(*(long **)(lVar1 + 0x588),selectionModel);
  (**(code **)(**(long **)(lVar1 + 0x580) + 0x1d0))(*(long **)(lVar1 + 0x580),selectionModel);
  QAbstractItemView::setSelectionModel((QAbstractItemView *)this,selectionModel);
  lVar2 = *(long *)(lVar1 + 800);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(void ***)(lVar1 + 0x328) != (void **)0x0))
  {
    ppvVar6 = *(void ***)(lVar1 + 0x328);
    if (*(int *)(lVar2 + 4) == 0) {
      ppvVar6 = (void **)0x0;
    }
    ppvVar3 = *(void ***)(lVar1 + 0x2f8);
    local_60.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x171;
    local_60._4_4_ = 0;
    local_60.m_impl = (ImplFn)0x0;
    local_48 = QItemSelectionModel::currentRowChanged;
    local_40 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QCallableObject<bool_(QAbstractItemModel::*)(),_QtPrivate::List<>,_void>::impl;
    *(undefined8 *)(puVar5 + 4) = 0x171;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_50,ppvVar6,(QObject *)&local_48,ppvVar3,&local_60,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    uVar4 = *(undefined8 *)(lVar1 + 0x5a0);
    *(undefined8 *)(lVar1 + 0x5a0) = local_50;
    local_50 = uVar4;
    QMetaObject::Connection::~Connection((Connection *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QTableView);
    Q_ASSERT(selectionModel);
    if (d->selectionModel) {
        // support row editing
        disconnect(d->selectionmodelConnection);
    }

    d->verticalHeader->setSelectionModel(selectionModel);
    d->horizontalHeader->setSelectionModel(selectionModel);
    QAbstractItemView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        // support row editing
        d->selectionmodelConnection =
            connect(d->selectionModel, &QItemSelectionModel::currentRowChanged,
                    d->model, &QAbstractItemModel::submit);
    }
}